

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeMergeTestLogs.cpp
# Opt level: O3

TestCaseResultPtr __thiscall LogHandler::startTestCaseResult(LogHandler *this,char *casePath)

{
  bool bVar1;
  char *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  TestCaseResultPtr *existingResult;
  TestCaseResultPtr TVar3;
  SharedPtrStateBase *pSVar2;
  
  bVar1 = xe::BatchResult::hasTestCaseResult(*(BatchResult **)(casePath + 8),in_RDX);
  if (bVar1) {
    xe::BatchResult::getTestCaseResult((BatchResult *)this,*(char **)(casePath + 8));
    xe::TestCaseResultData::clear
              ((TestCaseResultData *)(this->super_TestLogHandler)._vptr_TestLogHandler);
    pSVar2 = extraout_RDX;
  }
  else {
    TVar3 = xe::BatchResult::createTestCaseResult((BatchResult *)this,*(char **)(casePath + 8));
    pSVar2 = TVar3.m_state;
  }
  TVar3.m_state = pSVar2;
  TVar3.m_ptr = (TestCaseResultData *)this;
  return TVar3;
}

Assistant:

xe::TestCaseResultPtr startTestCaseResult (const char* casePath)
	{
		if (m_batchResult->hasTestCaseResult(casePath))
		{
			xe::TestCaseResultPtr existingResult = m_batchResult->getTestCaseResult(casePath);
			existingResult->clear();
			return existingResult;
		}
		else
			return m_batchResult->createTestCaseResult(casePath);
	}